

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

int ON_StringLengthWideChar(wchar_t *string)

{
  int iVar1;
  wchar_t *string_local;
  
  iVar1 = ON_StringLengthUTF32((ON__UINT32 *)string);
  return iVar1;
}

Assistant:

int ON_StringLengthWideChar(
  const wchar_t* string
  )
{
#if (1 == ON_SIZEOF_WCHAR_T)
  return ON_StringLengthUTF8((const char*)string);
#elif (2 == ON_SIZEOF_WCHAR_T)
  return ON_StringLengthUTF16((const ON__UINT16*)string);
#elif (4 == ON_SIZEOF_WCHAR_T)
  return ON_StringLengthUTF32((const ON__UINT32*)string);
#else
#error ON_SIZEOF_WCHAR_T is not defined or has an unexpected value
#endif
}